

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common.h
# Opt level: O0

string * TestSuite::getInfoMsg_abi_cxx11_(void)

{
  long lVar1;
  long *in_FS_OFFSET;
  
  if (*(char *)(*in_FS_OFFSET + -8) == '\0') {
    lVar1 = *in_FS_OFFSET;
    std::__cxx11::string::string((string *)(lVar1 + -0x28));
    __cxa_thread_atexit(std::__cxx11::string::~string,(string *)(lVar1 + -0x28),&__dso_handle);
    *(undefined1 *)(*in_FS_OFFSET + -8) = 1;
  }
  return (string *)(*in_FS_OFFSET + -0x28);
}

Assistant:

static std::string& getInfoMsg() {
        thread_local std::string info_msg;
        return info_msg;
    }